

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O0

void ncnn::conv3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum_1;
  int remain_1;
  float sum2;
  float sum;
  int remain;
  int i;
  float *k2;
  float *k1;
  float *k0;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float *kernel0;
  float *img0;
  float *outptr2;
  float *outptr;
  int q;
  float bias0;
  Mat out;
  int p;
  float *bias;
  float *kernel;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  float *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  float in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int iVar23;
  int local_150;
  int local_14c;
  float *local_130;
  float *local_128;
  float *local_120;
  float *local_118;
  Mat local_108;
  float *local_c8;
  float *local_c0;
  float *local_a8;
  int local_a0;
  float local_9c;
  Mat local_98;
  int local_54;
  float *local_50;
  float *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x2c);
  local_30 = *(int *)(in_RDI + 0x34);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x30);
  local_3c = *(int *)(in_RSI + 0x34);
  local_20 = in_RCX;
  local_48 = Mat::operator_cast_to_float_(in_RDX);
  local_50 = Mat::operator_cast_to_float_(local_20);
  for (local_54 = 0; local_54 < local_3c; local_54 = local_54 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    if (local_50 == (float *)0x0) {
      in_stack_fffffffffffffe9c = 0.0;
    }
    else {
      in_stack_fffffffffffffe9c = local_50[local_54];
    }
    local_9c = in_stack_fffffffffffffe9c;
    Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
              in_stack_fffffffffffffe9c);
    for (local_a0 = 0; local_a0 < local_30; local_a0 = local_a0 + 1) {
      in_stack_fffffffffffffe90 = Mat::operator_cast_to_float_(&local_98);
      local_c0 = in_stack_fffffffffffffe90 + local_34;
      local_a8 = in_stack_fffffffffffffe90;
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      pfVar19 = Mat::operator_cast_to_float_(&local_108);
      Mat::~Mat((Mat *)0x150bb5);
      pfVar20 = local_48 + (long)(local_54 * local_30 * 9) + (long)(local_a0 * 9);
      local_120 = pfVar19 + local_2c;
      local_128 = pfVar19 + (local_2c << 1);
      local_130 = pfVar19 + local_2c * 3;
      pfVar21 = pfVar20 + 3;
      pfVar22 = pfVar20 + 6;
      local_118 = pfVar19;
      for (local_14c = 0; local_14c + 1 < local_38; local_14c = local_14c + 2) {
        for (local_150 = local_34; 0 < local_150; local_150 = local_150 + -1) {
          fVar1 = *local_120;
          fVar2 = *pfVar20;
          fVar3 = local_120[1];
          fVar4 = pfVar20[1];
          fVar5 = local_120[2];
          fVar6 = pfVar20[2];
          fVar7 = *local_128;
          fVar8 = *pfVar21;
          fVar9 = local_128[1];
          fVar10 = pfVar20[4];
          fVar11 = local_128[2];
          fVar12 = pfVar20[5];
          fVar13 = *local_130;
          fVar14 = *pfVar22;
          fVar15 = local_130[1];
          fVar16 = pfVar20[7];
          fVar17 = local_130[2];
          fVar18 = pfVar20[8];
          *local_a8 = local_128[2] * pfVar20[8] +
                      local_128[1] * pfVar20[7] +
                      *local_128 * *pfVar22 +
                      local_120[2] * pfVar20[5] +
                      local_120[1] * pfVar20[4] +
                      *local_120 * *pfVar21 +
                      local_118[2] * pfVar20[2] +
                      local_118[1] * pfVar20[1] + *local_118 * *pfVar20 + 0.0 + *local_a8;
          *local_c0 = fVar17 * fVar18 +
                      fVar15 * fVar16 +
                      fVar13 * fVar14 +
                      fVar11 * fVar12 +
                      fVar9 * fVar10 +
                      fVar7 * fVar8 + fVar5 * fVar6 + fVar3 * fVar4 + fVar1 * fVar2 + 0.0 +
                      *local_c0;
          local_118 = local_118 + 1;
          local_120 = local_120 + 1;
          local_128 = local_128 + 1;
          local_130 = local_130 + 1;
          local_a8 = local_a8 + 1;
          local_c0 = local_c0 + 1;
        }
        local_118 = local_118 + (local_2c + 2);
        local_120 = local_120 + (local_2c + 2);
        local_128 = local_128 + (local_2c + 2);
        local_130 = local_130 + (local_2c + 2);
        local_a8 = local_a8 + local_34;
        local_c0 = local_c0 + local_34;
      }
      for (; iVar23 = local_34, local_14c < local_38; local_14c = local_14c + 1) {
        for (; 0 < iVar23; iVar23 = iVar23 + -1) {
          in_stack_fffffffffffffea0 =
               local_128[2] * pfVar20[8] +
               local_128[1] * pfVar20[7] +
               *local_128 * *pfVar22 +
               local_120[2] * pfVar20[5] +
               local_120[1] * pfVar20[4] +
               *local_120 * *pfVar21 +
               local_118[2] * pfVar20[2] + local_118[1] * pfVar20[1] + *local_118 * *pfVar20 + 0.0;
          *local_a8 = in_stack_fffffffffffffea0 + *local_a8;
          local_118 = local_118 + 1;
          local_120 = local_120 + 1;
          local_128 = local_128 + 1;
          local_a8 = local_a8 + 1;
        }
        local_118 = local_118 + 2;
        local_120 = local_120 + 2;
        local_128 = local_128 + 2;
        in_stack_fffffffffffffea4 = iVar23;
      }
      local_c8 = pfVar19;
    }
    Mat::~Mat((Mat *)0x15129d);
  }
  return;
}

Assistant:

static void conv3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q=0; q<inch; q++)
        {
            float* outptr = out;
            float* outptr2 = outptr + outw;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch*9  + q*9;

            const float* r0 = img0;
            const float* r1 = img0 + w;
            const float* r2 = img0 + w*2;
            const float* r3 = img0 + w*3;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            int i = 0;

            for (; i+1 < outh; i+=2)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;
                    float sum2 = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    sum2 += r1[0] * k0[0];
                    sum2 += r1[1] * k0[1];
                    sum2 += r1[2] * k0[2];
                    sum2 += r2[0] * k1[0];
                    sum2 += r2[1] * k1[1];
                    sum2 += r2[2] * k1[2];
                    sum2 += r3[0] * k2[0];
                    sum2 += r3[1] * k2[1];
                    sum2 += r3[2] * k2[2];

                    *outptr += sum;
                    *outptr2 += sum2;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    outptr++;
                    outptr2++;
                }

                r0 += 2 + w;
                r1 += 2 + w;
                r2 += 2 + w;
                r3 += 2 + w;

                outptr += outw;
                outptr2 += outw;
            }

            for (; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    *outptr += sum;

                    r0++;
                    r1++;
                    r2++;
                    outptr++;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

        }
    }

}